

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicswidget.cpp
# Opt level: O2

void QGraphicsWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  LayoutDirection LVar1;
  QPalette *palette;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 *paVar2;
  Data *pDVar3;
  undefined8 uVar4;
  char16_t *pcVar5;
  bool bVar6;
  int iVar7;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 aVar8;
  long in_FS_OFFSET;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  QSizeF QVar13;
  QArrayDataPointer<char16_t> local_38;
  undefined8 uStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      iVar7 = close((QGraphicsWidget *)_o,_c);
      if ((undefined1 *)*_a != (undefined1 *)0x0) {
        *(char *)*_a = (char)iVar7;
      }
    }
    else {
      if (_id == 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          layoutChanged((QGraphicsWidget *)_o);
          return;
        }
        goto LAB_005c7ed4;
      }
      if (_id == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          geometryChanged((QGraphicsWidget *)_o);
          return;
        }
        goto LAB_005c7ed4;
      }
    }
    break;
  case ReadProperty:
    if (0xd < (uint)_id) break;
    paVar2 = (anon_union_4_2_313b0b05_for_QSizePolicy_1 *)*_a;
    switch(_id) {
    case 0:
      QGraphicsWidget::palette((QGraphicsWidget *)&local_38);
      LVar1 = paVar2[2].data;
      paVar2[2].data = (LayoutDirection)local_38.ptr;
      local_38.ptr = (char16_t *)CONCAT44(local_38.ptr._4_4_,LVar1);
      pDVar3 = *(Data **)paVar2;
      *(Data **)paVar2 = local_38.d;
      local_38.d = pDVar3;
      QPalette::~QPalette((QPalette *)&local_38);
      break;
    case 1:
      font((QGraphicsWidget *)&local_38);
      pDVar3 = *(Data **)paVar2;
      *(Data **)paVar2 = local_38.d;
      LVar1 = paVar2[2].data;
      paVar2[2].data = (LayoutDirection)local_38.ptr;
      local_38.ptr = (char16_t *)CONCAT44(local_38.ptr._4_4_,LVar1);
      local_38.d = pDVar3;
      QFont::~QFont((QFont *)&local_38);
      break;
    case 2:
      aVar8.data = layoutDirection((QGraphicsWidget *)_o);
      goto LAB_005c7eb9;
    case 3:
      QVar13 = size((QGraphicsWidget *)_o);
      uVar11 = QVar13.ht._0_4_;
      uVar12 = QVar13.ht._4_4_;
      uVar9 = QVar13.wd._0_4_;
      uVar10 = QVar13.wd._4_4_;
      goto LAB_005c7e65;
    case 4:
      QVar13 = QGraphicsLayoutItem::minimumSize((QGraphicsLayoutItem *)(_o + 0x20));
      uVar11 = QVar13.ht._0_4_;
      uVar12 = QVar13.ht._4_4_;
      uVar9 = QVar13.wd._0_4_;
      uVar10 = QVar13.wd._4_4_;
      goto LAB_005c7e65;
    case 5:
      QVar13 = QGraphicsLayoutItem::preferredSize((QGraphicsLayoutItem *)(_o + 0x20));
      uVar11 = QVar13.ht._0_4_;
      uVar12 = QVar13.ht._4_4_;
      uVar9 = QVar13.wd._0_4_;
      uVar10 = QVar13.wd._4_4_;
      goto LAB_005c7e65;
    case 6:
      QVar13 = QGraphicsLayoutItem::maximumSize((QGraphicsLayoutItem *)(_o + 0x20));
      uVar11 = QVar13.ht._0_4_;
      uVar12 = QVar13.ht._4_4_;
      uVar9 = QVar13.wd._0_4_;
      uVar10 = QVar13.wd._4_4_;
LAB_005c7e65:
      *(ulong *)paVar2 = CONCAT44(uVar10,uVar9);
      *(ulong *)(paVar2 + 2) = CONCAT44(uVar12,uVar11);
      break;
    case 7:
      aVar8.bits = (Bits)QGraphicsLayoutItem::sizePolicy((QGraphicsLayoutItem *)(_o + 0x20));
      goto LAB_005c7eb9;
    case 8:
      aVar8 = *(anon_union_4_2_313b0b05_for_QSizePolicy_1 *)(*(long *)(_o + 0x18) + 0x1b8);
      goto LAB_005c7eb9;
    case 9:
      aVar8 = *(anon_union_4_2_313b0b05_for_QSizePolicy_1 *)(*(long *)(_o + 0x18) + 0x1d0);
LAB_005c7eb9:
      *paVar2 = aVar8;
      break;
    case 10:
      windowTitle((QString *)&local_38,(QGraphicsWidget *)_o);
      pDVar3 = *(Data **)paVar2;
      pcVar5 = *(char16_t **)(paVar2 + 2);
      *(Data **)paVar2 = local_38.d;
      *(char16_t **)(paVar2 + 2) = local_38.ptr;
      uVar4 = *(undefined8 *)(paVar2 + 4);
      *(qsizetype *)(paVar2 + 4) = local_38.size;
      local_38.d = pDVar3;
      local_38.ptr = pcVar5;
      local_38.size = uVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      break;
    case 0xb:
      QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(_o + 0x20));
      *(qsizetype *)(paVar2 + 4) = local_38.size;
      *(undefined8 *)(paVar2 + 6) = uStack_20;
      *(Data **)paVar2 = local_38.d;
      *(char16_t **)(paVar2 + 2) = local_38.ptr;
      break;
    case 0xc:
      *(undefined1 *)paVar2 =
           (char)((ushort)*(undefined2 *)(*(long *)(_o + 0x18) + 0x1b4) >> 0xd) & RightToLeft;
      break;
    case 0xd:
      *(undefined8 *)paVar2 = *(undefined8 *)(*(long *)(_o + 0x18) + 0x180);
    }
    break;
  case WriteProperty:
    if ((uint)_id < 0xe) {
      palette = (QPalette *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setPalette((QGraphicsWidget *)_o,palette);
          return;
        }
        break;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFont((QGraphicsWidget *)_o,(QFont *)palette);
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setLayoutDirection((QGraphicsWidget *)_o,*(LayoutDirection *)&palette->d);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          resize((QGraphicsWidget *)_o,(QSizeF *)palette);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QGraphicsLayoutItem::setMinimumSize((QGraphicsLayoutItem *)(_o + 0x20),(QSizeF *)palette);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QGraphicsLayoutItem::setPreferredSize
                    ((QGraphicsLayoutItem *)(_o + 0x20),(QSizeF *)palette);
          return;
        }
        break;
      case 6:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QGraphicsLayoutItem::setMaximumSize((QGraphicsLayoutItem *)(_o + 0x20),(QSizeF *)palette);
          return;
        }
        break;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QGraphicsLayoutItem::setSizePolicy
                    ((QGraphicsLayoutItem *)(_o + 0x20),(QSizePolicy *)palette);
          return;
        }
        break;
      case 8:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFocusPolicy((QGraphicsWidget *)_o,*(FocusPolicy *)&palette->d);
          return;
        }
        break;
      case 9:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setWindowFlags((QGraphicsWidget *)_o,
                         (QFlagsStorageHelper<Qt::WindowType,_4>)
                         *(QFlagsStorageHelper<Qt::WindowType,_4> *)&palette->d);
          return;
        }
        break;
      case 10:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setWindowTitle((QGraphicsWidget *)_o,(QString *)palette);
          return;
        }
        break;
      case 0xb:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          (**(code **)(*(long *)_o + 0x60))
                    (_o,palette,*(long *)(in_FS_OFFSET + 0x28),*(code **)(*(long *)_o + 0x60));
          return;
        }
        break;
      case 0xc:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setAutoFillBackground((QGraphicsWidget *)_o,*(bool *)&palette->d);
          return;
        }
        break;
      case 0xd:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setLayout((QGraphicsWidget *)_o,(QGraphicsLayout *)palette->d);
          return;
        }
      }
      goto LAB_005c7ed4;
    }
    break;
  default:
    if (_id == 2 && _c == ResetProperty) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        unsetLayoutDirection((QGraphicsWidget *)_o);
        return;
      }
      goto LAB_005c7ed4;
    }
    break;
  case IndexOfMethod:
    bVar6 = QtMocHelpers::indexOfMethod<void(QGraphicsWidget::*)()>
                      ((QtMocHelpers *)_a,(void **)geometryChanged,0,0);
    if (!bVar6) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QGraphicsWidget::*)()>
                  ((QtMocHelpers *)_a,(void **)layoutChanged,0,1);
        return;
      }
      goto LAB_005c7ed4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_005c7ed4:
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->geometryChanged(); break;
        case 1: _t->layoutChanged(); break;
        case 2: { bool _r = _t->close();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsWidget::*)()>(_a, &QGraphicsWidget::geometryChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsWidget::*)()>(_a, &QGraphicsWidget::layoutChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QPalette*>(_v) = _t->palette(); break;
        case 1: *reinterpret_cast<QFont*>(_v) = _t->font(); break;
        case 2: *reinterpret_cast<Qt::LayoutDirection*>(_v) = _t->layoutDirection(); break;
        case 3: *reinterpret_cast<QSizeF*>(_v) = _t->size(); break;
        case 4: *reinterpret_cast<QSizeF*>(_v) = _t->minimumSize(); break;
        case 5: *reinterpret_cast<QSizeF*>(_v) = _t->preferredSize(); break;
        case 6: *reinterpret_cast<QSizeF*>(_v) = _t->maximumSize(); break;
        case 7: *reinterpret_cast<QSizePolicy*>(_v) = _t->sizePolicy(); break;
        case 8: *reinterpret_cast<Qt::FocusPolicy*>(_v) = _t->focusPolicy(); break;
        case 9: *reinterpret_cast<Qt::WindowFlags*>(_v) = _t->windowFlags(); break;
        case 10: *reinterpret_cast<QString*>(_v) = _t->windowTitle(); break;
        case 11: *reinterpret_cast<QRectF*>(_v) = _t->geometry(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->autoFillBackground(); break;
        case 13: *reinterpret_cast<QGraphicsLayout**>(_v) = _t->layout(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setPalette(*reinterpret_cast<QPalette*>(_v)); break;
        case 1: _t->setFont(*reinterpret_cast<QFont*>(_v)); break;
        case 2: _t->setLayoutDirection(*reinterpret_cast<Qt::LayoutDirection*>(_v)); break;
        case 3: _t->resize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 4: _t->setMinimumSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 5: _t->setPreferredSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 6: _t->setMaximumSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 7: _t->setSizePolicy(*reinterpret_cast<QSizePolicy*>(_v)); break;
        case 8: _t->setFocusPolicy(*reinterpret_cast<Qt::FocusPolicy*>(_v)); break;
        case 9: _t->setWindowFlags(*reinterpret_cast<Qt::WindowFlags*>(_v)); break;
        case 10: _t->setWindowTitle(*reinterpret_cast<QString*>(_v)); break;
        case 11: _t->setGeometry(*reinterpret_cast<QRectF*>(_v)); break;
        case 12: _t->setAutoFillBackground(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setLayout(*reinterpret_cast<QGraphicsLayout**>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 2: _t->unsetLayoutDirection(); break;
        default: break;
        }
    }
}